

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::ReplaceTypeWithPredecessorType(ScriptFunction *this,DynamicType *previousType)

{
  ScriptFunctionType *pSVar1;
  ProxyEntryPointInfo *oldEntryPointInfo_00;
  ProxyEntryPointInfo *newEntryPointInfo_00;
  ProxyEntryPointInfo *newEntryPointInfo;
  ProxyEntryPointInfo *oldEntryPointInfo;
  DynamicType *previousType_local;
  ScriptFunction *this_local;
  
  pSVar1 = GetScriptFunctionType(this);
  oldEntryPointInfo_00 = ScriptFunctionType::GetEntryPointInfo(pSVar1);
  DynamicObject::ReplaceTypeWithPredecessorType((DynamicObject *)this,previousType);
  pSVar1 = GetScriptFunctionType(this);
  newEntryPointInfo_00 = ScriptFunctionType::GetEntryPointInfo(pSVar1);
  CopyEntryPointInfoToThreadContextIfNecessary(oldEntryPointInfo_00,newEntryPointInfo_00);
  return;
}

Assistant:

void ScriptFunction::ReplaceTypeWithPredecessorType(DynamicType * previousType)
    {
        ProxyEntryPointInfo* oldEntryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();
        __super::ReplaceTypeWithPredecessorType(previousType);
        ProxyEntryPointInfo* newEntryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();
        CopyEntryPointInfoToThreadContextIfNecessary(oldEntryPointInfo, newEntryPointInfo);
    }